

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O0

int __thiscall
AC3StreamReader::getTSDescriptor
          (AC3StreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  bool bVar3;
  double dVar4;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_64;
  undefined1 local_60 [4];
  int number_of_channels;
  BitStreamWriter bitWriter;
  int len;
  int skipBeforeBytes;
  int skipBytes;
  int i;
  uint8_t *frame;
  bool hdmvDescriptors_local;
  uint8_t *puStack_20;
  bool blurayMode_local;
  uint8_t *dstBuff_local;
  AC3StreamReader *this_local;
  
  frame._6_1_ = hdmvDescriptors;
  frame._7_1_ = blurayMode;
  puStack_20 = dstBuff;
  dstBuff_local = (uint8_t *)this;
  AC3Codec::setTestMode(&this->super_AC3Codec,true);
  _skipBytes = findFrame(this,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                              m_buffer,
                         (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd);
  if (_skipBytes == (uint8_t *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    skipBeforeBytes = 0;
    while( true ) {
      bVar3 = false;
      if (skipBeforeBytes < 2) {
        bVar3 = _skipBytes <
                (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
      }
      if (!bVar3) break;
      len = 0;
      bitWriter.m_bitWrited = 0;
      bitWriter.m_curVal =
           decodeFrame(this,_skipBytes,
                       (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,&len
                       ,(int *)&bitWriter.m_bitWrited);
      if ((int)bitWriter.m_curVal < 1) break;
      _skipBytes = _skipBytes + (int)(bitWriter.m_curVal + len);
      dVar4 = getFrameDuration(this);
      if (0.0 < dVar4) {
        skipBeforeBytes = skipBeforeBytes + 1;
      }
    }
    (this->super_AC3Codec).m_state = stateDecodeAC3;
    AC3Codec::setTestMode(&this->super_AC3Codec,false);
    BitStreamWriter::BitStreamWriter((BitStreamWriter *)local_60);
    bVar3 = AC3Codec::isAC3(&this->super_AC3Codec);
    if (bVar3) {
      *puStack_20 = '\x05';
      puStack_20[1] = '\x04';
      puStack_20[2] = 'A';
      puStack_20[3] = 'C';
      puStack_20[4] = '-';
      puStack_20[5] = '3';
      puStack_20[6] = 0x81;
      puVar1 = puStack_20 + 8;
      puStack_20[7] = '\x04';
      puVar2 = puStack_20 + 0xc;
      puStack_20 = puVar1;
      BitStreamWriter::setBuffer((BitStreamWriter *)local_60,puVar1,puVar2);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,3,(uint)(this->super_AC3Codec).m_fscod);
      BitStreamWriter::putBits
                ((BitStreamWriter *)local_60,5,(uint)(this->super_AC3Codec).m_bsidBase);
      BitStreamWriter::putBits
                ((BitStreamWriter *)local_60,6,(this->super_AC3Codec).m_frmsizecod >> 1);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,2,(uint)(this->super_AC3Codec).m_dsurmod)
      ;
      BitStreamWriter::putBits((BitStreamWriter *)local_60,3,(uint)(this->super_AC3Codec).m_bsmod);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,4,(uint)(this->super_AC3Codec).m_acmod);
      BitStreamWriter::putBit((BitStreamWriter *)local_60,0);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,8,0);
      BitStreamWriter::flushBits((BitStreamWriter *)local_60);
      this_local._4_4_ = 0xc;
    }
    else {
      *puStack_20 = '\x05';
      puStack_20[1] = '\x04';
      puStack_20[2] = 'E';
      puStack_20[3] = 'A';
      puStack_20[4] = 'C';
      puStack_20[5] = '3';
      puStack_20[6] = 0xcc;
      puVar1 = puStack_20 + 8;
      puStack_20[7] = '\x04';
      puVar2 = puStack_20 + 0xc;
      puStack_20 = puVar1;
      BitStreamWriter::setBuffer((BitStreamWriter *)local_60,puVar1,puVar2);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,4,0xc);
      BitStreamWriter::putBits
                ((BitStreamWriter *)local_60,1,(uint)((this->super_AC3Codec).m_mixinfoexists & 1));
      BitStreamWriter::putBits((BitStreamWriter *)local_60,3,0);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,5,0x18);
      if ((this->super_AC3Codec).m_acmod == '\0') {
        local_78 = 1;
      }
      else {
        if ((this->super_AC3Codec).m_acmod == '\x01') {
          local_7c = 0;
        }
        else {
          if ((this->super_AC3Codec).m_acmod == '\x02') {
            local_80 = 2;
            if ((this->super_AC3Codec).m_dsurmod != '\0') {
              local_80 = 3;
            }
          }
          else {
            local_80 = 4;
          }
          local_7c = local_80;
        }
        local_78 = local_7c;
      }
      local_64 = local_78;
      if (((this->super_AC3Codec).m_extChannelsExists & 1U) != 0) {
        local_64 = 5;
      }
      BitStreamWriter::putBits((BitStreamWriter *)local_60,3,local_64);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,3,1);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,5,(uint)(this->super_AC3Codec).m_bsid);
      BitStreamWriter::putBits((BitStreamWriter *)local_60,8,0x80);
      BitStreamWriter::flushBits((BitStreamWriter *)local_60);
      this_local._4_4_ = 0xc;
    }
  }
  return this_local._4_4_;
}

Assistant:

int AC3StreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, bool hdmvDescriptors)
{
    AC3Codec::setTestMode(true);
    uint8_t* frame = findFrame(m_buffer, m_bufEnd);
    if (frame == nullptr)
        return 0;
    for (int i = 0; i < 2 && frame < m_bufEnd;)
    {
        int skipBytes = 0;
        int skipBeforeBytes = 0;
        const int len = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
        if (len < 1)
        {
            // m_state = stateDecodeAC3;
            // AC3Codec::setTestMode(false);
            // return 0;
            break;
        }
        frame += len + skipBytes;
        if (getFrameDuration() > 0)
            i++;
    }
    m_state = AC3State::stateDecodeAC3;
    AC3Codec::setTestMode(false);
    BitStreamWriter bitWriter{};

    if (isAC3())
    {
        // ATSC A/52 Annex A Table A3.1 AC-3 Registration Descriptor
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::REGISTRATION);  // descriptor tag
        *dstBuff++ = 4;                                                    // decriptor length
        *dstBuff++ = 'A';
        *dstBuff++ = 'C';
        *dstBuff++ = '-';
        *dstBuff++ = '3';

        // ATSC A/52 Annex A Table A4.1 AC-3 Audio Descriptor Syntax
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::AC3);  // AC-3_audio_stream_descriptor
        *dstBuff++ = 4;                                           // descriptor len

        bitWriter.setBuffer(dstBuff, dstBuff + 4);

        bitWriter.putBits(3, m_fscod);     // bitrate code
        bitWriter.putBits(5, m_bsidBase);  // 6 = AC3

        bitWriter.putBits(6, m_frmsizecod >> 1);  // MSB == 0. bit rate is exact
        bitWriter.putBits(2, m_dsurmod);

        bitWriter.putBits(3, m_bsmod);
        bitWriter.putBits(4, m_acmod);  // when MSB == 0 then high (4-th) bit always 0
        bitWriter.putBit(0);            // full_svc

        bitWriter.putBits(8, 0);  // langcod
        bitWriter.flushBits();

        return 12;
    }

    // Not AC3 => EAC3
    // ATSC A/52 Annex G 2.EAC3 Registration Descriptor
    *dstBuff++ = static_cast<int>(TSDescriptorTag::REGISTRATION);  // descriptor tag
    *dstBuff++ = 4;                                                // descriptor length
    *dstBuff++ = 'E';
    *dstBuff++ = 'A';
    *dstBuff++ = 'C';
    *dstBuff++ = '3';

    // ATSC A/52 Annex G Table G.1
    *dstBuff++ = static_cast<int>(TSDescriptorTag::EAC3);  // EAC3_audio_stream_descriptor
    *dstBuff++ = 4;                                        // descriptor len

    bitWriter.setBuffer(dstBuff, dstBuff + 4);

    bitWriter.putBits(4, 12);  // reserved = 1, bsid_flag = 1, mainid_flag = 0, asvc_flag = 0
    bitWriter.putBits(1, m_mixinfoexists);
    bitWriter.putBits(3, 0);  // independant substreams not supported

    bitWriter.putBits(5, 24);  // reserved = 1, full_service_flag = 1, audio_service_type = 0 (Complete Main)
    int number_of_channels = (m_acmod == 0 ? 1 : (m_acmod == 1 ? 0 : (m_acmod == 2 ? (m_dsurmod ? 3 : 2) : 4)));
    if (m_extChannelsExists)
        number_of_channels = 5;
    bitWriter.putBits(3, number_of_channels);

    bitWriter.putBits(3, 1);  // language_flag = 0, language_flag2 = 0, reserved = 1
    bitWriter.putBits(5, m_bsid);

    bitWriter.putBits(8, 0x80);  // additional_info_byte
    bitWriter.flushBits();

    return 12;
}